

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O0

void deqp::gls::MultiTextureSamplerTest::setSamplerState
               (Functions *gl,SamplingState state,GLuint sampler)

{
  GLenum GVar1;
  GLuint sampler_local;
  Functions *gl_local;
  
  (*gl->samplerParameteri)(sampler,0x2801,state.minFilter);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glSamplerParameteri(sampler, GL_TEXTURE_MIN_FILTER, state.minFilter)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x268);
  (*gl->samplerParameteri)(sampler,0x2800,state.magFilter);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glSamplerParameteri(sampler, GL_TEXTURE_MAG_FILTER, state.magFilter)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x26a);
  (*gl->samplerParameteri)(sampler,0x2802,state.wrapS);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glSamplerParameteri(sampler, GL_TEXTURE_WRAP_S, state.wrapS)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x26c);
  (*gl->samplerParameteri)(sampler,0x2803,state.wrapT);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glSamplerParameteri(sampler, GL_TEXTURE_WRAP_T, state.wrapT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x26e);
  (*gl->samplerParameteri)(sampler,0x8072,state.wrapR);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glSamplerParameteri(sampler, GL_TEXTURE_WRAP_R, state.wrapR)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x270);
  (*gl->samplerParameterf)(sampler,0x813b,state.maxLod);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glSamplerParameterf(sampler, GL_TEXTURE_MAX_LOD, state.maxLod)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x272);
  (*gl->samplerParameterf)(sampler,0x813a,state.minLod);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"glSamplerParameterf(sampler, GL_TEXTURE_MIN_LOD, state.minLod)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x274);
  return;
}

Assistant:

void MultiTextureSamplerTest::setSamplerState (const glw::Functions& gl, SamplingState state, GLuint sampler)
{
	gl.samplerParameteri(sampler, GL_TEXTURE_MIN_FILTER, state.minFilter);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glSamplerParameteri(sampler, GL_TEXTURE_MIN_FILTER, state.minFilter)");
	gl.samplerParameteri(sampler, GL_TEXTURE_MAG_FILTER, state.magFilter);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glSamplerParameteri(sampler, GL_TEXTURE_MAG_FILTER, state.magFilter)");
	gl.samplerParameteri(sampler, GL_TEXTURE_WRAP_S, state.wrapS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glSamplerParameteri(sampler, GL_TEXTURE_WRAP_S, state.wrapS)");
	gl.samplerParameteri(sampler, GL_TEXTURE_WRAP_T, state.wrapT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glSamplerParameteri(sampler, GL_TEXTURE_WRAP_T, state.wrapT)");
	gl.samplerParameteri(sampler, GL_TEXTURE_WRAP_R, state.wrapR);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glSamplerParameteri(sampler, GL_TEXTURE_WRAP_R, state.wrapR)");
	gl.samplerParameterf(sampler, GL_TEXTURE_MAX_LOD, state.maxLod);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glSamplerParameterf(sampler, GL_TEXTURE_MAX_LOD, state.maxLod)");
	gl.samplerParameterf(sampler, GL_TEXTURE_MIN_LOD, state.minLod);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glSamplerParameterf(sampler, GL_TEXTURE_MIN_LOD, state.minLod)");
}